

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

reference * __thiscall
mjs::interpreter::impl::scope::lookup(reference *__return_storage_ptr__,scope *this,string *id)

{
  bool bVar1;
  object *this_00;
  scope *this_01;
  gc_heap_ptr<mjs::object> local_60 [2];
  object_ptr local_40;
  wstring_view local_30;
  string *local_20;
  string *id_local;
  scope *this_local;
  
  local_20 = id;
  id_local = (string *)this;
  this_local = (scope *)__return_storage_ptr__;
  this_00 = gc_heap_ptr_untracked<mjs::object,_true>::dereference(&this->activation_,this->heap_);
  local_30 = string::view(local_20);
  bVar1 = object::has_property(this_00,&local_30);
  if (bVar1) {
    gc_heap_ptr_untracked<mjs::object,_true>::track
              ((gc_heap_ptr_untracked<mjs::object,_true> *)&local_40,(gc_heap *)&this->activation_);
    reference::reference(__return_storage_ptr__,&local_40,local_20);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_40);
  }
  else {
    bVar1 = mjs::gc_heap_ptr_untracked::operator_cast_to_bool((gc_heap_ptr_untracked *)&this->prev_)
    ;
    if (bVar1) {
      this_01 = gc_heap_ptr_untracked<mjs::interpreter::impl::scope,_true>::dereference
                          (&this->prev_,this->heap_);
      lookup(__return_storage_ptr__,this_01,local_20);
    }
    else {
      gc_heap_ptr<mjs::object>::gc_heap_ptr(local_60,(nullptr_t)0x0);
      reference::reference(__return_storage_ptr__,local_60,local_20);
      gc_heap_ptr<mjs::object>::~gc_heap_ptr(local_60);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

reference lookup(const string& id) const {
            if (activation_.dereference(heap_).has_property(id.view())) {
                return reference{activation_.track(heap_), id};
            }
            if (prev_) {
                return prev_.dereference(heap_).lookup(id);
            } else {
                return reference{nullptr, id};
            }
        }